

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O3

void __thiscall icu_63::UnicodeString::UnicodeString(UnicodeString *this,UChar32 ch)

{
  int16_t iVar1;
  long lVar2;
  
  (this->super_Replaceable).super_UObject._vptr_UObject = (_func_int **)&PTR__UnicodeString_003e4fd8
  ;
  (this->fUnion).fStackFields.fLengthAndFlags = 2;
  if ((uint)ch < 0x10000) {
    iVar1 = 0x22;
    lVar2 = 10;
  }
  else {
    if (0x10ffff < (uint)ch) {
      return;
    }
    (this->fUnion).fStackFields.fBuffer[0] = (short)((uint)ch >> 10) + L'ퟀ';
    ch = ch & 0x3ffU | 0xdc00;
    iVar1 = 0x42;
    lVar2 = 0xc;
  }
  *(short *)((long)&(this->super_Replaceable).super_UObject._vptr_UObject + lVar2) = (short)ch;
  (this->fUnion).fStackFields.fLengthAndFlags = iVar1;
  return;
}

Assistant:

UnicodeString::UnicodeString(UChar32 ch) {
  fUnion.fFields.fLengthAndFlags = kShortString;
  int32_t i = 0;
  UBool isError = FALSE;
  U16_APPEND(fUnion.fStackFields.fBuffer, i, US_STACKBUF_SIZE, ch, isError);
  // We test isError so that the compiler does not complain that we don't.
  // If isError then i==0 which is what we want anyway.
  if(!isError) {
    setShortLength(i);
  }
}